

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpgd.cpp
# Opt level: O1

void __thiscall jpgd::jpeg_decoder::word_clear(jpeg_decoder *this,void *p,uint16 c,uint n)

{
  uint8 *pD;
  long lVar1;
  
  if (n != 0) {
    lVar1 = 0;
    do {
      *(char *)((long)p + lVar1 * 2) = (char)c;
      *(char *)((long)p + lVar1 * 2 + 1) = (char)(c >> 8);
      lVar1 = lVar1 + 1;
    } while (n != (uint)lVar1);
  }
  return;
}

Assistant:

void jpeg_decoder::word_clear(void* p, uint16 c, uint n) {
  uint8* pD = (uint8*)p;
  const uint8 l = c & 0xFF, h = (c >> 8) & 0xFF;
  while (n) {
    pD[0] = l;
    pD[1] = h;
    pD += 2;
    n--;
  }
}